

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::null_scoped_padder>::format
          (short_filename_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_3,memory_buf_t *dest)

{
  bool bVar1;
  memory_buf_t *in_RCX;
  long in_RSI;
  basic_string_view<char> *in_RDI;
  null_scoped_padder p;
  size_t text_size;
  char *filename;
  null_scoped_padder p_1;
  char *s;
  memory_buf_t *in_stack_ffffffffffffffb0;
  string_view_t in_stack_ffffffffffffffb8;
  null_scoped_padder local_21;
  memory_buf_t *local_20;
  long local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    null_scoped_padder::null_scoped_padder(&local_21,0,(padding_info *)&in_RDI->size_,local_20);
  }
  else {
    basename(*(char **)(local_10 + 0x38));
    bVar1 = padding_info::enabled((padding_info *)&in_RDI->size_);
    if (bVar1) {
      s = (char *)CLI::std::char_traits<char>::length((char_type *)0x6e5bd8);
    }
    else {
      s = (char *)0x0;
    }
    null_scoped_padder::null_scoped_padder
              ((null_scoped_padder *)&stack0xffffffffffffffc7,(size_t)s,
               (padding_info *)&in_RDI->size_,local_20);
    ::fmt::v11::basic_string_view<char>::basic_string_view(in_RDI,s);
    fmt_helper::append_string_view(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        auto filename = basename(msg.source.filename);
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(filename, dest);
    }